

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

void __thiscall
cmFilePathChecksum::setupParentDirs
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  reference pvVar1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string *local_30;
  string *projectBinDir_local;
  string *projectSrcDir_local;
  string *currentBinDir_local;
  string *currentSrcDir_local;
  cmFilePathChecksum *this_local;
  
  local_30 = projectBinDir;
  projectBinDir_local = projectSrcDir;
  projectSrcDir_local = currentBinDir;
  currentBinDir_local = currentSrcDir;
  currentSrcDir_local = (string *)this;
  cmsys::SystemTools::GetRealPath(&local_50,currentSrcDir,(string *)0x0);
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,0);
  std::__cxx11::string::operator=((string *)pvVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  cmsys::SystemTools::GetRealPath(&local_70,projectSrcDir_local,(string *)0x0);
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,1);
  std::__cxx11::string::operator=((string *)pvVar1,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  cmsys::SystemTools::GetRealPath(&local_90,projectBinDir_local,(string *)0x0);
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,2);
  std::__cxx11::string::operator=((string *)pvVar1,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmsys::SystemTools::GetRealPath(&local_b0,local_30,(string *)0x0);
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,3);
  std::__cxx11::string::operator=((string *)pvVar1,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,0);
  std::__cxx11::string::operator=((string *)&pvVar1->second,"CurrentSource");
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,1);
  std::__cxx11::string::operator=((string *)&pvVar1->second,"CurrentBinary");
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,2);
  std::__cxx11::string::operator=((string *)&pvVar1->second,"ProjectSource");
  pvVar1 = std::
           array<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_4UL>
           ::operator[](&this->parentDirs,3);
  std::__cxx11::string::operator=((string *)&pvVar1->second,"ProjectBinary");
  return;
}

Assistant:

void cmFilePathChecksum::setupParentDirs(std::string const& currentSrcDir,
                                         std::string const& currentBinDir,
                                         std::string const& projectSrcDir,
                                         std::string const& projectBinDir)
{
  this->parentDirs[0].first = cmSystemTools::GetRealPath(currentSrcDir);
  this->parentDirs[1].first = cmSystemTools::GetRealPath(currentBinDir);
  this->parentDirs[2].first = cmSystemTools::GetRealPath(projectSrcDir);
  this->parentDirs[3].first = cmSystemTools::GetRealPath(projectBinDir);

  this->parentDirs[0].second = "CurrentSource";
  this->parentDirs[1].second = "CurrentBinary";
  this->parentDirs[2].second = "ProjectSource";
  this->parentDirs[3].second = "ProjectBinary";
}